

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

Options * __thiscall
ApprovalTests::Options::withScrubber
          (Options *__return_storage_ptr__,Options *this,Scrubber *scrubber)

{
  pointer pcVar1;
  _Manager_type p_Var2;
  Reporter *reporter;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  shared_ptr<ApprovalTests::ApprovalNamer> local_58;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  char local_30 [16];
  
  local_48 = (undefined1  [8])(this->fileOptions_).options_;
  pcVar1 = (this->fileOptions_).fileExtensionWithDot_._M_dataplus._M_p;
  local_40._M_p = local_30;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,
             pcVar1 + (this->fileOptions_).fileExtensionWithDot_._M_string_length);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  local_60 = scrubber->_M_invoker;
  p_Var2 = (scrubber->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(scrubber->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(scrubber->super__Function_base)._M_functor + 8);
    (scrubber->super__Function_base)._M_manager = (_Manager_type)0x0;
    scrubber->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var2;
  }
  reporter = this->reporter_;
  local_58.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->namer_).super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_58.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (this->namer_).
          super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_58.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  Options(__return_storage_ptr__,(FileOptions *)local_48,(Scrubber *)&local_78,reporter,false,
          &local_58);
  if (local_58.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_58.super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
  }
  if (local_40._M_p != local_30) {
    operator_delete(local_40._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Options Options::withScrubber(Scrubber scrubber) const
    {
        return Options(fileOptions_, std::move(scrubber), reporter_, false, namer_);
    }